

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::ExpectationBase::DescribeLocationTo(ExpectationBase *this,ostream *os)

{
  ostream *poVar1;
  ostream *in_RSI;
  ExpectationBase *in_RDI;
  int in_stack_00000054;
  string local_30 [48];
  
  file(in_RDI);
  line(in_RDI);
  FormatFileLocation_abi_cxx11_((char *)os,in_stack_00000054);
  poVar1 = std::operator<<(in_RSI,local_30);
  std::operator<<(poVar1," ");
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void DescribeLocationTo(::std::ostream* os) const {
    *os << FormatFileLocation(file(), line()) << " ";
  }